

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O3

bool __thiscall
BamTools::Fasta::FastaPrivate::Open(FastaPrivate *this,string *filename,string *indexFilename)

{
  bool bVar1;
  FILE *pFVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  
  pFVar2 = fopen64((filename->_M_dataplus)._M_p,"rb");
  this->Stream = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"FASTA error: Could not open ",0x1c);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    pcVar5 = " for reading";
    lVar4 = 0xc;
  }
  else {
    this->IsOpen = true;
    if (indexFilename->_M_string_length == 0) {
      return true;
    }
    pFVar2 = fopen64((indexFilename->_M_dataplus)._M_p,"rb");
    this->IndexStream = (FILE *)pFVar2;
    if (pFVar2 != (FILE *)0x0) {
      this->IsIndexOpen = true;
      bVar1 = LoadIndexData(this);
      this->HasIndex = bVar1;
      return bVar1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"FASTA error : Could not open ",0x1d);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(indexFilename->_M_dataplus)._M_p,
                        indexFilename->_M_string_length);
    pcVar5 = " for reading.";
    lVar4 = 0xd;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return false;
}

Assistant:

bool Fasta::FastaPrivate::Open(const std::string& filename, const std::string& indexFilename)
{

    bool success = true;

    // open FASTA filename
    Stream = fopen(filename.c_str(), "rb");
    if (!Stream) {
        std::cerr << "FASTA error: Could not open " << filename << " for reading" << std::endl;
        return false;
    }
    IsOpen = true;
    success &= IsOpen;

    // open index file if it exists
    if (!indexFilename.empty()) {
        IndexStream = fopen(indexFilename.c_str(), "rb");
        if (!IndexStream) {
            std::cerr << "FASTA error : Could not open " << indexFilename << " for reading."
                      << std::endl;
            return false;
        }
        IsIndexOpen = true;
        success &= IsIndexOpen;

        // attempt to load index data
        HasIndex = LoadIndexData();
        success &= HasIndex;
    }

    // return success status
    return success;
}